

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O2

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>::ComputeSolutionKernelHdivT<double>
          (TPZCompElKernelHDiv3D<pzshape::TPZShapePrism> *this,TPZMaterialDataT<double> *data)

{
  TPZSolVec<double> *sol;
  TPZManVector<double,_10> *pTVar1;
  TPZFNMatrix<30,_double> *pTVar2;
  TPZMaterialDataT<double> *pTVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  TPZCompMesh *pTVar7;
  TPZFMatrix<double> *pTVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double local_68;
  TPZMaterialDataT<double> *local_60;
  long local_58;
  TPZManVector<TPZManVector<double,_10>,_20> *local_50;
  TPZManVector<TPZManVector<double,_10>,_20> *local_48;
  long local_40;
  long local_38;
  
  sol = &data->sol;
  local_50 = &data->curlsol;
  local_60 = data;
  TPZCompElHCurl<pzshape::TPZShapePrism>::ComputeSolutionHCurlT<double>
            (&this->super_TPZCompElHCurl<pzshape::TPZShapePrism>,
             &(data->super_TPZMaterialData).phi.super_TPZFMatrix<double>,
             &(data->super_TPZMaterialData).curlphi.super_TPZFMatrix<double>,sol,local_50);
  plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).
                                          super_TPZIntelGen<pzshape::TPZShapePrism>.
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))(this);
  iVar5 = (**(code **)(*plVar6 + 0x78))(plVar6);
  (**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).
                         super_TPZIntelGen<pzshape::TPZShapePrism>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x90))(this);
  pTVar7 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar7->fSolution);
  if ((pTVar8->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol == 1) {
    local_48 = sol;
    TPZManVector<TPZManVector<double,_10>,_20>::Resize(sol,1);
    pTVar3 = local_60;
    TPZManVector<TPZFNMatrix<30,_double>,_20>::Resize(&local_60->dsol,1);
    TPZManVector<TPZManVector<double,_10>,_20>::Resize(&pTVar3->divsol,1);
    pTVar3 = local_60;
    lVar9 = (long)(iVar5 * 3);
    local_38 = (long)iVar5;
    local_58 = 0;
    lVar11 = 0;
    lVar10 = 1;
    local_40 = lVar9;
    while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
      pTVar1 = (pTVar3->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
      (**(code **)(*(long *)((long)pTVar1->fExtAlloc + lVar11 + -0x20) + 0x18))
                ((long)pTVar1->fExtAlloc + lVar11 + -0x20,lVar9);
      local_68 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((pTVar3->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
                 lVar11 + -0x20),&local_68,0,-1);
      lVar4 = local_58;
      pTVar2 = (pTVar3->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
      (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                     (&((TPZFMatrix<double> *)
                                       (&(pTVar2->super_TPZFMatrix<double>).fPivot + -1))->fPivot +
                                     -1))->fPivot + 0xffffffffffffffff) + local_58) + 0x70))
                ((long)(&((TPZFMatrix<double> *)
                         (&((TPZFMatrix<double> *)(&(pTVar2->super_TPZFMatrix<double>).fPivot + -1))
                           ->fPivot + -1))->fPivot + 0xffffffffffffffff) + local_58,lVar9,3);
      pTVar1 = (pTVar3->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
      (**(code **)(*(long *)((long)pTVar1->fExtAlloc + lVar11 + -0x20) + 0x18))
                ((long)pTVar1->fExtAlloc + lVar11 + -0x20,local_38);
      local_68 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((pTVar3->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc
                 + lVar11 + -0x20),&local_68,0,-1);
      lVar11 = lVar11 + 0x70;
      local_58 = lVar4 + 0x188;
    }
    TPZManVector<TPZManVector<double,_10>,_20>::operator=(local_48,local_50);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElKernelHDiv3D.cpp"
             ,0xaf);
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeSolutionKernelHdivT(TPZMaterialDataT<TVar> &data)
{
    this->ComputeSolutionHCurlT(data.phi, data.curlphi,
                                data.sol, data.curlsol);

    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }
    data.sol = data.curlsol;

}